

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O2

void __thiscall
EncodingTable::addEntry(EncodingTable *this,uchar *hex,size_t hexLength,string *value)

{
  TableEntry entry;
  
  if (value->_M_string_length != 0) {
    Trie::insert(&this->lookup,(value->_M_dataplus)._M_p,
                 ((long)(this->entries).
                        super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->entries).
                       super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    entry.hexPos = ByteArray::append(&this->hexData,hex,hexLength);
    entry.valueLen = value->_M_string_length;
    entry.hexLen = hexLength;
    std::vector<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>::push_back
              (&this->entries,&entry);
  }
  return;
}

Assistant:

void EncodingTable::addEntry(unsigned char* hex, size_t hexLength, const std::string& value)
{
	if (value.size() == 0)
		return;
	
	// insert into trie
	size_t index = entries.size();
	lookup.insert(value.c_str(),index);

	// add entry
	TableEntry entry;
	entry.hexPos = hexData.append(hex,hexLength);
	entry.hexLen = hexLength;
	entry.valueLen = value.size();

	entries.push_back(entry);
}